

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O1

int default_import_callback
              (void *ctx,char *dir,char *file,char **found_here_cptr,char **buf,size_t *buflen)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  undefined8 uVar2;
  size_type sVar3;
  ImportStatus IVar4;
  JsonnetVm *__dest;
  char *pcVar5;
  JsonnetVm *pJVar6;
  int iVar7;
  string err_msg;
  string found_here;
  string input;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  jpaths;
  allocator<char> local_ea;
  allocator<char> local_e9;
  undefined1 local_e8 [32];
  size_t *local_c8;
  _Base_ptr local_c0;
  string local_b8;
  string local_98;
  string local_78;
  undefined1 local_58 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  char **local_38;
  
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  local_78._M_string_length = 0;
  local_78.field_2._M_local_buf[0] = '\0';
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  local_98._M_string_length = 0;
  local_98.field_2._M_local_buf[0] = '\0';
  local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
  local_b8._M_string_length = 0;
  local_b8.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::string<std::allocator<char>>((string *)local_e8,dir,&local_ea);
  std::__cxx11::string::string<std::allocator<char>>((string *)local_58,file,&local_e9);
  IVar4 = try_path((string *)local_e8,(string *)local_58,&local_78,&local_98,&local_b8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._0_8_ != &local_48) {
    operator_delete((void *)local_58._0_8_,local_48._M_allocated_capacity + 1);
  }
  if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
    operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
  }
  pJVar6 = (JsonnetVm *)local_58;
  local_c8 = buflen;
  local_c0 = (_Base_ptr)buf;
  local_38 = found_here_cptr;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)pJVar6,
           (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)((long)ctx + 0xc0));
  do {
    uVar2 = local_58._8_8_;
    if (IVar4 != IMPORT_STATUS_FILE_NOT_FOUND) {
      if (IVar4 == IMPORT_STATUS_OK) {
        iVar7 = 0;
        __dest = (JsonnetVm *)
                 jsonnet_realloc(pJVar6,(char *)0x0,
                                 (size_t)((long)(_Rb_tree_color *)local_98._M_string_length + 1));
        pJVar6 = __dest;
        memcpy(__dest,local_98._M_dataplus._M_p,
               (size_t)((long)(_Rb_tree_color *)local_98._M_string_length + 1));
        *local_38 = (char *)__dest;
        pcVar5 = jsonnet_realloc(pJVar6,(char *)0x0,local_78._M_string_length);
        sVar3 = local_78._M_string_length;
        memcpy(pcVar5,local_78._M_dataplus._M_p,local_78._M_string_length);
        *local_c8 = sVar3;
        *(char **)local_c0 = pcVar5;
      }
      else {
        pcVar5 = jsonnet_realloc(pJVar6,(char *)0x0,local_b8._M_string_length);
        sVar3 = local_b8._M_string_length;
        memcpy(pcVar5,local_b8._M_dataplus._M_p,local_b8._M_string_length);
        *local_c8 = sVar3;
        *(char **)local_c0 = pcVar5;
LAB_00175ab7:
        iVar7 = 1;
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_58);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,
                        CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                                 local_b8.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_98._M_dataplus._M_p != &local_98.field_2) {
        operator_delete(local_98._M_dataplus._M_p,
                        CONCAT71(local_98.field_2._M_allocated_capacity._1_7_,
                                 local_98.field_2._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,
                        CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                 local_78.field_2._M_local_buf[0]) + 1);
      }
      return iVar7;
    }
    if (local_58._8_8_ == local_58._0_8_) {
      pJVar6 = (JsonnetVm *)local_e8;
      local_e8._0_8_ = local_e8 + 0x10;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)pJVar6,"no match locally or in the Jsonnet library paths.","");
      pcVar5 = jsonnet_realloc(pJVar6,(char *)0x0,local_e8._8_8_);
      uVar2 = local_e8._0_8_;
      memcpy(pcVar5,(void *)local_e8._0_8_,local_e8._8_8_);
      *local_c8 = local_e8._8_8_;
      *(char **)local_c0 = pcVar5;
      if ((undefined1 *)uVar2 != local_e8 + 0x10) {
        operator_delete((void *)uVar2,local_e8._16_8_ + 1);
      }
      goto LAB_00175ab7;
    }
    std::__cxx11::string::string<std::allocator<char>>((string *)local_e8,file,&local_ea);
    IVar4 = try_path((string *)(uVar2 + -0x20),(string *)local_e8,&local_78,&local_98,&local_b8);
    if ((undefined1 *)local_e8._0_8_ != local_e8 + 0x10) {
      operator_delete((void *)local_e8._0_8_,local_e8._16_8_ + 1);
    }
    paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
              *)(local_58._8_8_ + -0x20);
    pJVar6 = *(JsonnetVm **)(local_58._8_8_ + -0x20);
    pcVar5 = (char *)(local_58._8_8_ + -0x10);
    local_58._8_8_ = paVar1;
    if (pJVar6 != (JsonnetVm *)pcVar5) {
      operator_delete(pJVar6,*(long *)pcVar5 + 1);
    }
  } while( true );
}

Assistant:

static int default_import_callback(void *ctx, const char *dir, const char *file,
                                   char **found_here_cptr, char **buf, size_t *buflen)
{
    auto *vm = static_cast<JsonnetVm *>(ctx);

    std::string input, found_here, err_msg;

    ImportStatus status = try_path(dir, file, input, found_here, err_msg);

    std::vector<std::string> jpaths(vm->jpaths);

    // If not found, try library search path.
    while (status == IMPORT_STATUS_FILE_NOT_FOUND) {
        if (jpaths.size() == 0) {
            const char *err = "no match locally or in the Jsonnet library paths.";
            *buf = from_string_nonull(vm, err, buflen);
            return 1;  // failure
        }
        status = try_path(jpaths.back(), file, input, found_here, err_msg);
        jpaths.pop_back();
    }

    if (status == IMPORT_STATUS_IO_ERROR) {
        *buf = from_string_nonull(vm, err_msg, buflen);
        return 1;  // failure
    }

    assert(status == IMPORT_STATUS_OK);
    *found_here_cptr = from_string(vm, found_here);
    *buf = from_string_nonull(vm, input, buflen);
    return 0;  // success
}